

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_intersection.c
# Opt level: O2

int run_bitset_container_intersection_cardinality(run_container_t *src_1,bitset_container_t *src_2)

{
  ushort uVar1;
  ushort uVar2;
  uint64_t *puVar3;
  _Bool _Var4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  
  _Var4 = run_container_is_full(src_1);
  if (_Var4) {
    iVar5 = src_2->cardinality;
  }
  else {
    uVar12 = 0;
    uVar6 = (ulong)(uint)src_1->n_runs;
    if (src_1->n_runs < 1) {
      uVar6 = uVar12;
    }
    iVar5 = 0;
    for (; uVar12 != uVar6; uVar12 = uVar12 + 1) {
      uVar1 = src_1->runs[uVar12].value;
      uVar2 = src_1->runs[uVar12].length;
      puVar3 = src_2->words;
      uVar11 = (uint)uVar2 + (uint)uVar1;
      uVar8 = (ulong)(uint)(uVar1 >> 6);
      uVar7 = uVar11 >> 6;
      bVar10 = (byte)uVar1;
      if (uVar1 >> 6 == uVar7) {
        uVar8 = (0xffffffffffffffffU >> (0x3fU - (char)uVar2 & 0x3f)) << (bVar10 & 0x3f) &
                puVar3[uVar8];
        uVar8 = uVar8 - (uVar8 >> 1 & 0x5555555555555555);
        uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333);
        uVar7 = (uint)(byte)(((uVar8 >> 4) + uVar8 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)
        ;
      }
      else {
        uVar13 = (puVar3[uVar8] >> (bVar10 & 0x3f)) << (bVar10 & 0x3f);
        uVar13 = uVar13 - (uVar13 >> 1 & 0x5555555555555555);
        uVar13 = (uVar13 >> 2 & 0x3333333333333333) + (uVar13 & 0x3333333333333333);
        uVar13 = ((uVar13 >> 4) + uVar13 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38;
        while( true ) {
          uVar8 = uVar8 + 1;
          if (uVar7 <= uVar8) break;
          uVar9 = puVar3[uVar8] - (puVar3[uVar8] >> 1 & 0x5555555555555555);
          uVar9 = (uVar9 >> 2 & 0x3333333333333333) + (uVar9 & 0x3333333333333333);
          uVar13 = (ulong)((int)uVar13 +
                          (uint)(byte)(((uVar9 >> 4) + uVar9 & 0xf0f0f0f0f0f0f0f) *
                                       0x101010101010101 >> 0x38));
        }
        bVar10 = ~(byte)uVar11;
        uVar8 = (puVar3[uVar7] << (bVar10 & 0x3f)) >> (bVar10 & 0x3f);
        uVar8 = uVar8 - (uVar8 >> 1 & 0x5555555555555555);
        uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333);
        uVar7 = (int)uVar13 +
                (uint)(byte)(((uVar8 >> 4) + uVar8 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)
        ;
      }
      iVar5 = iVar5 + uVar7;
    }
  }
  return iVar5;
}

Assistant:

int run_bitset_container_intersection_cardinality(
    const run_container_t *src_1, const bitset_container_t *src_2) {
    if (run_container_is_full(src_1)) {
        return bitset_container_cardinality(src_2);
    }
    int answer = 0;
    for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
        rle16_t rle = src_1->runs[rlepos];
        answer +=
            bitset_lenrange_cardinality(src_2->words, rle.value, rle.length);
    }
    return answer;
}